

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

LinkedTag __thiscall LinkedReadsDatastore::get_read_tag(LinkedReadsDatastore *this,size_t readID)

{
  size_t sVar1;
  reference pvVar2;
  ulong in_RSI;
  long in_RDI;
  
  if ((in_RSI != 0) && (sVar1 = size((LinkedReadsDatastore *)0x3c2783), in_RSI <= sVar1)) {
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x110),
                        in_RSI - 1 >> 1);
    return *pvVar2;
  }
  return 0;
}

Assistant:

LinkedTag LinkedReadsDatastore::get_read_tag(size_t readID) {
    if (readID==0 or readID>size()) return 0;
    return read_tag[(readID-1)/2];
}